

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void generate_code(CompiledCommand *ccmd,CodeGenerator *codegen)

{
  int iVar1;
  pointer pvVar2;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *arg;
  pointer v;
  char local_34;
  unsigned_short local_32;
  anon_class_8_1_bb7db123 local_30;
  
  if (codegen->oatc == (CustomHeaderOATC *)0x0) {
    local_34 = '\0';
  }
  else {
    CustomHeaderOATC::find_opcode(codegen->oatc,ccmd->command);
    if (local_34 != '\0') goto LAB_00158344;
  }
  local_32 = 0;
LAB_00158344:
  if ((local_34 == '\0') && ((ccmd->command->id).super_OptionalBase<unsigned_short>.init_ != false))
  {
    local_34 = '\x01';
    local_32 = (ccmd->command->id).super_OptionalBase<unsigned_short>.storage_.value_;
  }
  if (local_34 != '\0') {
    iVar1 = *(int *)ccmd;
    BinaryWriter::emplace_u8(&codegen->bw,(uint8_t)local_32);
    BinaryWriter::emplace_u8(&codegen->bw,(byte)((uint)(iVar1 << 0xf) >> 8) | (byte)(local_32 >> 8))
    ;
    v = (ccmd->args).
        super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (ccmd->args).
             super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (v != pvVar2) {
      do {
        local_30.codegen = codegen;
        eggs::variants::detail::
        apply<void,generate_code(eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>const&,CodeGenerator&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,false,false>const&>
                  (&local_30,&v->_storage);
        v = v + 1;
      } while (v != pvVar2);
    }
    return;
  }
  ProgramContext::fatal_error<tag_nocontext_t,std::__cxx11::string_const&>
            (codegen->program,(tag_nocontext_t *)&nocontext,
             "could not compile command {}, no id or no hash [-moatc]",&ccmd->command->name);
}

Assistant:

inline void generate_code(const CompiledCommand& ccmd, CodeGenerator& codegen)
{
    optional<uint16_t> opcode;

    if(codegen.oatc)
        opcode = codegen.oatc->find_opcode(ccmd.command);

    if(opcode == nullopt)
        opcode = ccmd.command.id;

    if(opcode == nullopt)
        codegen.program.fatal_error(nocontext, "could not compile command {}, no id or no hash [-moatc]", ccmd.command.name);

    codegen.bw.emplace_u16(*opcode | (ccmd.not_flag? 0x8000 : 0x0000));
    for(auto& arg : ccmd.args) ::generate_code(arg, codegen);
}